

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O1

vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> * __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::MoveSegments
          (vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *__return_storage_ptr__,
          SegmentTree<duckdb::RowGroup,_true> *this)

{
  pointer pSVar1;
  bool bVar2;
  SegmentLock l;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->node_lock;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  do {
    bVar2 = LoadNextSegment(this,(SegmentLock *)&local_28);
  } while (bVar2);
  pSVar1 = (this->nodes).
           super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
           .
           super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ).
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->nodes).
       super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       .
       super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ).
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
  (__return_storage_ptr__->
  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ).
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->nodes).
       super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       .
       super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->nodes).
  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).
  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).
  super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return __return_storage_ptr__;
}

Assistant:

vector<SegmentNode<T>> MoveSegments() {
		auto l = Lock();
		return MoveSegments(l);
	}